

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

void * __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_char_*)>,_density::basic_default_allocator<65536UL>_>
::consume_operation::element_ptr(consume_operation *this)

{
  bool bVar1;
  void *pvVar2;
  consume_operation *this_local;
  
  bVar1 = empty(this);
  if (bVar1) {
    density_tests::detail::assert_failed<>("!empty()",anon_var_dwarf_12e55,0x408);
  }
  pvVar2 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_char_*)>,_density::basic_default_allocator<65536UL>_>
           ::get_element(this->m_control);
  return pvVar2;
}

Assistant:

void * element_ptr() const noexcept
            {
                DENSITY_ASSERT(!empty());
                return get_element(m_control);
            }